

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O1

void __thiscall leveldb::MemTableIterator::Next(MemTableIterator *this)

{
  long lVar1;
  Node *pNVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (this->iter_).node_;
  if (pNVar2 == (Node *)0x0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/skiplist.h"
                  ,0xd0,
                  "void leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Iterator::Next() [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                 );
  }
  (this->iter_).node_ = pNVar2->next_[0]._M_b._M_p;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Next() override { iter_.Next(); }